

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

void __thiscall CVmObjByteArray::load_image_data(CVmObjByteArray *this,char *ptr,size_t siz)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong __n;
  long lVar4;
  char *__src;
  
  (*(this->super_CVmObject)._vptr_CVmObject[2])(this,0);
  uVar2 = (ulong)*(uint *)ptr;
  if (uVar2 + 4 < siz) {
    siz = uVar2 + 4;
  }
  alloc_array(this,uVar2);
  if (siz < uVar2 * 5 + 2) {
    fill_with(this,'\0',1,uVar2);
  }
  __src = ptr + 4;
  lVar4 = 1;
  for (uVar2 = siz - 4; uVar2 != 0; uVar2 = uVar2 - __n) {
    uVar1 = (uint)(lVar4 - 1U);
    uVar3 = (ulong)(uVar1 & 0x7fff);
    __n = 0x8000 - uVar3;
    if (uVar2 <= __n) {
      __n = uVar2;
    }
    memcpy((void *)(uVar3 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                               (lVar4 - 1U >> 0x1c) * 8 + 4) +
                                     (ulong)(uVar1 >> 0xc & 0xfff8))),__src,__n);
    lVar4 = lVar4 + __n;
    __src = __src + __n;
  }
  return;
}

Assistant:

void CVmObjByteArray::load_image_data(VMG_ const char *ptr, size_t siz)
{
    unsigned long cnt;
    unsigned long idx;

    /* if we already have memory allocated, free it */
    notify_delete(vmg_ FALSE);

    /* get the new array size */
    cnt = t3rp4u(ptr);

    /* make sure the size isn't larger than we'd expect */
    if (siz > 4 + cnt)
        siz = 4 + cnt;

    /* allocate memory at the new size as indicated in the image data */
    alloc_array(vmg_ cnt);

    /* if the size is smaller than we'd expect, set extra elements to nil */
    if (siz < VMB_LEN + (VMB_DATAHOLDER * cnt))
    {
        /* fill everything with zeros to start with */
        fill_with(0, 1, cnt);
    }

    /* copy the bytes */
    for (ptr += 4, siz -= 4, idx = 1 ; siz != 0 ; )
    {
        unsigned char *dstp;
        size_t chunk_size;
        size_t avail;

        /* get the next chunk */
        dstp = get_ele_ptr(idx, &avail);

        /* limit this chunk size to the remaining copy size */
        chunk_size = avail;
        if (chunk_size > siz)
            chunk_size = siz;

        /* copy this chunk */
        memcpy(dstp, ptr, chunk_size);

        /* advance past this chunk */
        idx += chunk_size;
        ptr += chunk_size;
        siz -= chunk_size;
    }
}